

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O0

void __thiscall asmjit::v1_14::CodeWriter::remove8(CodeWriter *this,uint8_t *where)

{
  undefined1 *puVar1;
  undefined1 *in_RSI;
  long *in_RDI;
  uint8_t *p;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  undefined1 *local_18;
  
  local_18 = in_RSI;
  if (in_RSI < (undefined1 *)*in_RDI) {
    while (puVar1 = local_18 + 1, puVar1 != (undefined1 *)*in_RDI) {
      *local_18 = *puVar1;
      local_18 = puVar1;
    }
    *in_RDI = *in_RDI + -1;
    return;
  }
  DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
}

Assistant:

ASMJIT_FORCE_INLINE void remove8(uint8_t* where) noexcept {
    ASMJIT_ASSERT(where < _cursor);

    uint8_t* p = where;
    while (++p != _cursor)
      p[-1] = p[0];
    _cursor--;
  }